

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O2

vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *
wasm::analysis::ReachingDefinitionsTransferFunction::listLocalSets
          (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__return_storage_ptr__,
          Function *func,
          vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_> *fakeInitialValueSets,
          unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
          *fakeSetPtrs)

{
  pointer pLVar1;
  ulong uVar2;
  Index i;
  uint uVar3;
  long lVar4;
  undefined1 auStack_68 [8];
  FindAll<wasm::LocalSet> setFinder;
  LocalSet *local_40;
  vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *local_38;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setsList;
  
  uVar3 = 0;
  local_38 = (vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)__return_storage_ptr__;
  while( true ) {
    uVar2 = wasm::Function::getNumLocals();
    if (uVar2 <= uVar3) break;
    auStack_68[0] = LocalSetId;
    setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(setFinder.list.
                           super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,uVar3);
    std::vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>::push_back
              (fakeInitialValueSets,(value_type *)auStack_68);
    uVar3 = uVar3 + 1;
  }
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)auStack_68,func->body);
  *(undefined1 (*) [8])local_38 = auStack_68;
  *(pointer *)(local_38 + 8) =
       setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(local_38 + 0x10) =
       setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  for (uVar2 = 0;
      pLVar1 = (fakeInitialValueSets->
               super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(fakeInitialValueSets->
                            super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 5);
      uVar2 = uVar2 + 1) {
    local_40 = (LocalSet *)
               ((long)&(pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                       _id + lVar4);
    std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::emplace_back<wasm::LocalSet*>
              (local_38,&local_40);
    local_40 = (LocalSet *)
               ((long)&(((fakeInitialValueSets->
                         super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>).
                         _M_impl.super__Vector_impl_data._M_start)->
                       super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
               lVar4);
    std::__detail::
    _Insert<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)fakeSetPtrs,&local_40);
    lVar4 = lVar4 + 0x20;
  }
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)auStack_68);
  return (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_38;
}

Assistant:

static std::vector<LocalSet*>
  listLocalSets(Function* func,
                std::vector<LocalSet>& fakeInitialValueSets,
                std::unordered_set<LocalSet*>& fakeSetPtrs) {
    // Create a fictitious LocalSet for each local index.
    for (Index i = 0; i < func->getNumLocals(); ++i) {
      LocalSet currSet;
      currSet.index = i;
      fakeInitialValueSets.push_back(currSet);
    }

    // Find all actual LocalSets.
    FindAll<LocalSet> setFinder(func->body);
    std::vector<LocalSet*> setsList = std::move(setFinder.list);

    // Take a pointer for each fictitious LocalSet.
    for (size_t i = 0; i < fakeInitialValueSets.size(); ++i) {
      setsList.push_back(&fakeInitialValueSets[i]);
      fakeSetPtrs.insert(&fakeInitialValueSets[i]);
    }
    return setsList;
  }